

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

void kwsysProcessesSignalHandler(int signum,siginfo_t *info,void *ucontext)

{
  cmsysProcess *pcVar1;
  kwsysProcess_ssize_t status;
  cmsysProcess *cp;
  char buf;
  void *pvStack_20;
  int i;
  void *ucontext_local;
  siginfo_t *info_local;
  int signum_local;
  
  pvStack_20 = ucontext;
  ucontext_local = info;
  info_local._4_4_ = signum;
  for (cp._4_4_ = 0; cp._4_4_ < kwsysProcesses.Count; cp._4_4_ = cp._4_4_ + 1) {
    cp._3_1_ = 1;
    pcVar1 = kwsysProcesses.Processes[cp._4_4_];
    read(pcVar1->PipeReadEnds[2],(void *)((long)&cp + 3),1);
    write(pcVar1->SignalPipe,(void *)((long)&cp + 3),1);
  }
  return;
}

Assistant:

static void kwsysProcessesSignalHandler(int signum
#if KWSYSPE_USE_SIGINFO
                                        , siginfo_t* info, void* ucontext
#endif
  )
{
  (void)signum;
#if KWSYSPE_USE_SIGINFO
  (void)info;
  (void)ucontext;
#endif

  /* Signal all process objects that a child has terminated.  */
  {
  int i;
  for(i=0; i < kwsysProcesses.Count; ++i)
    {
    /* Set the pipe in a signalled state.  */
    char buf = 1;
    kwsysProcess* cp = kwsysProcesses.Processes[i];
    kwsysProcess_ssize_t status=
      read(cp->PipeReadEnds[KWSYSPE_PIPE_SIGNAL], &buf, 1);
    (void)status;
    status=write(cp->SignalPipe, &buf, 1);
    (void)status;
    }
  }

#if !KWSYSPE_USE_SIGINFO
  /* Re-Install our handler for SIGCHLD.  Repeat call until it is not
     interrupted.  */
  {
  struct sigaction newSigChldAction;
  memset(&newSigChldAction, 0, sizeof(struct sigaction));
  newSigChldAction.sa_handler = kwsysProcessesSignalHandler;
  newSigChldAction.sa_flags = SA_NOCLDSTOP;
  while((sigaction(SIGCHLD, &newSigChldAction,
                   &kwsysProcessesOldSigChldAction) < 0) &&
        (errno == EINTR));
  }
#endif
}